

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)4>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,undefined8 *xn,xpath_allocator *alloc,
          undefined4 param_5)

{
  xml_node xVar1;
  bool bVar2;
  xml_node_struct *n;
  xml_node_struct *n_00;
  xml_node local_40;
  undefined4 local_34;
  
  local_34 = param_5;
  if (xn[1] == 0) {
    local_40._root = (xml_node_struct *)*xn;
  }
  else {
    xml_node::xml_node(&local_40);
  }
  if (local_40._root != (xml_node_struct *)0x0) {
    if (xn[1] == 0) {
      local_40._root = (xml_node_struct *)*xn;
    }
    else {
      xml_node::xml_node(&local_40);
    }
    xVar1._root = local_40._root;
    n_00 = (local_40._root)->first_child;
    if (n_00 != (xml_node_struct *)0x0) {
      bVar2 = step_push(this,ns,n_00,alloc);
      if (((byte)local_34 & bVar2) == 0) {
        do {
          n = n_00->first_child;
          if (n == (xml_node_struct *)0x0) {
            while (n = n_00->next_sibling, n == (xml_node_struct *)0x0) {
              n_00 = n_00->parent;
              if (n_00 == xVar1._root) {
                return;
              }
            }
          }
          bVar2 = step_push(this,ns,n,alloc);
          n_00 = n;
        } while ((bVar2 & (byte)local_34) != 1);
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}